

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_OrderingTrumpsSpecificity_Test::
DiskSourceTreeTest_OrderingTrumpsSpecificity_Test
          (DiskSourceTreeTest_OrderingTrumpsSpecificity_Test *this)

{
  DiskSourceTreeTest_OrderingTrumpsSpecificity_Test *this_local;
  
  DiskSourceTreeTest::DiskSourceTreeTest(&this->super_DiskSourceTreeTest);
  (this->super_DiskSourceTreeTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskSourceTreeTest_OrderingTrumpsSpecificity_Test_02a07f30;
  return;
}

Assistant:

TEST_F(DiskSourceTreeTest, OrderingTrumpsSpecificity) {
  // Test that directories are always searched in order, even when a latter
  // directory is more-specific than a former one.

  // Create the "bar" directory so we can put a file in it.
  ABSL_CHECK_OK(File::CreateDir(absl::StrCat(dirnames_[0], "/bar"),
                                0777));

  // Add files and map paths.
  AddFile(absl::StrCat(dirnames_[0], "/bar/foo"), "Hello World!");
  AddFile(absl::StrCat(dirnames_[1], "/foo"), "This file should be hidden.");
  source_tree_.MapPath("", dirnames_[0]);
  source_tree_.MapPath("bar", dirnames_[1]);

  // Check.
  ExpectFileContents("bar/foo", "Hello World!");
}